

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O2

int32_t bocu1Prev(int32_t c)

{
  uint uVar1;
  
  uVar1 = 0x3070;
  if (((0x309f < c) && (uVar1 = 0x7711, 0x51a5 < c - 0x4e00U)) && (uVar1 = 0xc1d1, (uint)c < 0xac00)
     ) {
    uVar1 = c & 0xff80U | 0x40;
  }
  return uVar1;
}

Assistant:

static inline int32_t
bocu1Prev(int32_t c) {
    /* compute new prev */
    if(/* 0x3040<=c && */ c<=0x309f) {
        /* Hiragana is not 128-aligned */
        return 0x3070;
    } else if(0x4e00<=c && c<=0x9fa5) {
        /* CJK Unihan */
        return 0x4e00-BOCU1_REACH_NEG_2;
    } else if(0xac00<=c /* && c<=0xd7a3 */) {
        /* Korean Hangul */
        return (0xd7a3+0xac00)/2;
    } else {
        /* mostly small scripts */
        return BOCU1_SIMPLE_PREV(c);
    }
}